

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkList.c
# Opt level: O1

void TraverseDlist(DuNode_conflict List)

{
  DuNode *pDVar1;
  
  pDVar1 = List->Next;
  printf(anon_var_dwarf_ae);
  if (pDVar1 == (DuNode *)0x0) {
    printf(anon_var_dwarf_b8);
  }
  else {
    do {
      printf("%d ",(ulong)(uint)pDVar1->Element);
      pDVar1 = pDVar1->Next;
    } while (pDVar1 != (DuNode *)0x0);
  }
  putchar(10);
  return;
}

Assistant:

void TraverseDlist(DuNode List) {
    DuNode P = List->Next;    //    首节点赋值给临时节点P
    printf("遍历链表的值为：");
    if (P == NULL)
        printf("链表为空");
    while (P != NULL)        //当临时节点P不为尾节点时，输出当前节点值
    {
        printf("%d ", P->Element);
        P = P->Next;
    }
    printf("\n");
}